

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

HTS_Boolean
HTS_Model_load_pdf(HTS_Model *model,HTS_File *fp,size_t vector_length,size_t num_windows,
                  HTS_Boolean is_msd)

{
  size_t *psVar1;
  size_t sVar2;
  float ***pppfVar3;
  float **ppfVar4;
  float *pfVar5;
  size_t sVar6;
  size_t in_RCX;
  size_t in_RDX;
  long in_RSI;
  HTS_Model *in_RDI;
  HTS_Boolean in_R8B;
  size_t len;
  HTS_Boolean result;
  size_t k;
  size_t j;
  uint32_t i;
  HTS_File *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  char cVar7;
  void *in_stack_ffffffffffffffc0;
  void *buf;
  ulong local_38;
  uint in_stack_ffffffffffffffd0;
  undefined3 in_stack_ffffffffffffffd4;
  undefined4 uVar8;
  HTS_Boolean local_1;
  
  uVar8 = CONCAT13(in_R8B,in_stack_ffffffffffffffd4);
  cVar7 = '\x01';
  if (((in_RDI == (HTS_Model *)0x0) || (in_RSI == 0)) || (in_RDI->ntree == 0)) {
    HTS_error(1,"HTS_Model_load_pdf: File for pdfs is not specified.\n");
    local_1 = '\0';
  }
  else {
    in_RDI->vector_length = in_RDX;
    in_RDI->num_windows = in_RCX;
    in_RDI->is_msd = in_R8B;
    psVar1 = (size_t *)HTS_calloc(CONCAT17(1,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0);
    in_RDI->npdf = psVar1;
    in_RDI->npdf = in_RDI->npdf + -2;
    for (local_38 = 2; local_38 <= in_RDI->ntree + 1; local_38 = local_38 + 1) {
      sVar2 = HTS_fread_little_endian
                        (in_stack_ffffffffffffffc0,CONCAT17(cVar7,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (sVar2 != 1) {
        cVar7 = '\0';
        break;
      }
      in_RDI->npdf[local_38] = (ulong)in_stack_ffffffffffffffd0;
    }
    for (local_38 = 2; local_38 <= in_RDI->ntree + 1; local_38 = local_38 + 1) {
      if (in_RDI->npdf[local_38] == 0) {
        HTS_error(1,"HTS_Model_load_pdf: # of pdfs at %d-th state should be positive.\n",local_38);
        cVar7 = '\0';
        break;
      }
    }
    if (cVar7 == '\0') {
      in_RDI->npdf = in_RDI->npdf + 2;
      free(in_RDI->npdf);
      HTS_Model_initialize(in_RDI);
      local_1 = '\0';
    }
    else {
      pppfVar3 = (float ***)
                 HTS_calloc(CONCAT17(cVar7,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0);
      in_RDI->pdf = pppfVar3;
      in_RDI->pdf = in_RDI->pdf + -2;
      if ((char)((uint)uVar8 >> 0x18) == '\0') {
        sVar2 = in_RDI->vector_length * in_RDI->num_windows * 2;
      }
      else {
        sVar2 = in_RDI->vector_length * in_RDI->num_windows * 2 + 1;
      }
      for (local_38 = 2; local_38 <= in_RDI->ntree + 1; local_38 = local_38 + 1) {
        ppfVar4 = (float **)HTS_calloc(CONCAT17(cVar7,in_stack_ffffffffffffffb8),sVar2);
        in_RDI->pdf[local_38] = ppfVar4;
        in_RDI->pdf[local_38] = in_RDI->pdf[local_38] + -1;
        for (buf = (void *)0x1; buf <= (void *)in_RDI->npdf[local_38]; buf = (void *)((long)buf + 1)
            ) {
          pfVar5 = (float *)HTS_calloc(CONCAT17(cVar7,in_stack_ffffffffffffffb8),sVar2);
          in_RDI->pdf[local_38][(long)buf] = pfVar5;
          sVar6 = HTS_fread_little_endian
                            (buf,CONCAT17(cVar7,in_stack_ffffffffffffffb8),sVar2,
                             in_stack_ffffffffffffffa8);
          if (sVar6 != sVar2) {
            cVar7 = '\0';
          }
        }
      }
      if (cVar7 == '\0') {
        HTS_Model_clear((HTS_Model *)CONCAT44(uVar8,in_stack_ffffffffffffffd0));
        local_1 = '\0';
      }
      else {
        local_1 = '\x01';
      }
    }
  }
  return local_1;
}

Assistant:

static HTS_Boolean HTS_Model_load_pdf(HTS_Model * model, HTS_File * fp, size_t vector_length, size_t num_windows, HTS_Boolean is_msd)
{
   uint32_t i;
   size_t j, k;
   HTS_Boolean result = TRUE;
   size_t len;

   /* check */
   if (model == NULL || fp == NULL || model->ntree <= 0) {
      HTS_error(1, "HTS_Model_load_pdf: File for pdfs is not specified.\n");
      return FALSE;
   }

   /* read MSD flag */
   model->vector_length = vector_length;
   model->num_windows = num_windows;
   model->is_msd = is_msd;
   model->npdf = (size_t *) HTS_calloc(model->ntree, sizeof(size_t));
   model->npdf -= 2;
   /* read the number of pdfs */
   for (j = 2; j <= model->ntree + 1; j++) {
      if (HTS_fread_little_endian(&i, sizeof(i), 1, fp) != 1) {
         result = FALSE;
         break;
      }
      model->npdf[j] = (size_t) i;
   }
   for (j = 2; j <= model->ntree + 1; j++) {
      if (model->npdf[j] <= 0) {
         HTS_error(1, "HTS_Model_load_pdf: # of pdfs at %d-th state should be positive.\n", j);
         result = FALSE;
         break;
      }
   }
   if (result == FALSE) {
      model->npdf += 2;
      free(model->npdf);
      HTS_Model_initialize(model);
      return FALSE;
   }
   model->pdf = (float ***) HTS_calloc(model->ntree, sizeof(float **));
   model->pdf -= 2;
   /* read means and variances */
   if (is_msd)                  /* for MSD */
      len = model->vector_length * model->num_windows * 2 + 1;
   else
      len = model->vector_length * model->num_windows * 2;
   for (j = 2; j <= model->ntree + 1; j++) {
      model->pdf[j] = (float **) HTS_calloc(model->npdf[j], sizeof(float *));
      model->pdf[j]--;
      for (k = 1; k <= model->npdf[j]; k++) {
         model->pdf[j][k] = (float *) HTS_calloc(len, sizeof(float));
         if (HTS_fread_little_endian(model->pdf[j][k], sizeof(float), len, fp) != len)
            result = FALSE;
      }
   }
   if (result == FALSE) {
      HTS_Model_clear(model);
      return FALSE;
   }
   return TRUE;
}